

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O0

void ihevc_weighted_pred_chroma_uni
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD32 wgt0_cb,
               WORD32 wgt0_cr,WORD32 off0_cb,WORD32 off0_cr,WORD32 shift,WORD32 lvl_shift,WORD32 ht,
               WORD32 wd)

{
  byte bVar1;
  int local_3c;
  UWORD8 local_38;
  int local_34;
  UWORD8 local_30;
  WORD32 i4_tmp;
  WORD32 col;
  WORD32 row;
  WORD32 wgt0_cr_local;
  WORD32 wgt0_cb_local;
  WORD32 dst_strd_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_dst_local;
  WORD16 *pi2_src_local;
  
  pu1_dst_local = pu1_dst;
  pi2_src_local = pi2_src;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; SBORROW4(col,wd * 2) != col + wd * -2 < 0; col = col + 2) {
      bVar1 = (byte)shift;
      local_34 = ((1 << (bVar1 - 1 & 0x1f)) + (pi2_src_local[col] + lvl_shift) * wgt0_cb >>
                 (bVar1 & 0x1f)) + off0_cb;
      if (local_34 < 0x100) {
        if (local_34 < 0) {
          local_34 = 0;
        }
        local_30 = (UWORD8)local_34;
      }
      else {
        local_30 = 0xff;
      }
      pu1_dst_local[col] = local_30;
      local_3c = ((1 << (bVar1 - 1 & 0x1f)) + (pi2_src_local[col + 1] + lvl_shift) * wgt0_cr >>
                 (bVar1 & 0x1f)) + off0_cr;
      if (local_3c < 0x100) {
        if (local_3c < 0) {
          local_3c = 0;
        }
        local_38 = (UWORD8)local_3c;
      }
      else {
        local_38 = 0xff;
      }
      pu1_dst_local[col + 1] = local_38;
    }
    pi2_src_local = pi2_src_local + src_strd;
    pu1_dst_local = pu1_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_uni(WORD16 *pi2_src,
                                    UWORD8 *pu1_dst,
                                    WORD32 src_strd,
                                    WORD32 dst_strd,
                                    WORD32 wgt0_cb,
                                    WORD32 wgt0_cr,
                                    WORD32 off0_cb,
                                    WORD32 off0_cr,
                                    WORD32 shift,
                                    WORD32 lvl_shift,
                                    WORD32 ht,
                                    WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i4_tmp = (pi2_src[col] + lvl_shift) * wgt0_cb;
            i4_tmp += 1 << (shift - 1);
            i4_tmp = (i4_tmp >> shift) + off0_cb;

            pu1_dst[col] = CLIP_U8(i4_tmp);

            i4_tmp = (pi2_src[col + 1] + lvl_shift) * wgt0_cr;
            i4_tmp += 1 << (shift - 1);
            i4_tmp = (i4_tmp >> shift) + off0_cr;

            pu1_dst[col + 1] = CLIP_U8(i4_tmp);
        }

        pi2_src += src_strd;
        pu1_dst += dst_strd;
    }
}